

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::ComputeMinContributionValues
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this)

{
  ulong uVar1;
  size_type sVar2;
  size_t sVar3;
  reference pvVar4;
  ostream *poVar5;
  long in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double c;
  Index ja;
  double minValue;
  Index i;
  vector<double,_std::allocator<double>_> *minValues;
  vector<double,_std::allocator<double>_> *in_stack_00000128;
  Interface_ProblemToPolicyDiscrete in_stack_ffffffffffffff48;
  BGIP_SolverBranchAndBound<JointPolicyPureVector> *in_stack_ffffffffffffff50;
  size_type in_stack_ffffffffffffff58;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff60;
  string local_60 [32];
  double local_40;
  uint local_34;
  Interface_ProblemToPolicyDiscrete local_30;
  uint local_28;
  undefined1 local_11;
  
  local_11 = 0;
  boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::operator->
            ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)(in_RSI + 0x128));
  BayesianGameBase::GetNrJointTypes((BayesianGameBase *)in_stack_ffffffffffffff50);
  std::allocator<double>::allocator((allocator<double> *)0x932a04);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
             (allocator_type *)in_stack_ffffffffffffff50);
  std::allocator<double>::~allocator((allocator<double> *)0x932a27);
  for (local_28 = 0; uVar1 = (ulong)local_28,
      sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RDI), uVar1 != sVar2;
      local_28 = local_28 + 1) {
    local_30._vptr_Interface_ProblemToPolicyDiscrete = (_func_int **)0x7fefffffffffffff;
    local_34 = 0;
    while( true ) {
      uVar1 = (ulong)local_34;
      boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::operator->
                ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)(in_RSI + 0x128));
      sVar3 = BayesianGameBase::GetNrJointActions((BayesianGameBase *)in_stack_ffffffffffffff50);
      if (uVar1 == sVar3) break;
      local_40 = GetContribution(in_stack_ffffffffffffff50,
                                 (Index)((ulong)in_stack_ffffffffffffff48.
                                                _vptr_Interface_ProblemToPolicyDiscrete >> 0x20),
                                 (Index)in_stack_ffffffffffffff48.
                                        _vptr_Interface_ProblemToPolicyDiscrete);
      in_stack_ffffffffffffff50 =
           (BGIP_SolverBranchAndBound<JointPolicyPureVector> *)
           std::min<double>(&local_40,(double *)&local_30);
      local_30._vptr_Interface_ProblemToPolicyDiscrete =
           (in_stack_ffffffffffffff50->
           super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
           super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver.
           _vptr_BayesianGameIdenticalPayoffSolver;
      local_34 = local_34 + 1;
    }
    in_stack_ffffffffffffff48._vptr_Interface_ProblemToPolicyDiscrete =
         local_30._vptr_Interface_ProblemToPolicyDiscrete;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(ulong)local_28);
    *pvVar4 = (value_type)in_stack_ffffffffffffff48._vptr_Interface_ProblemToPolicyDiscrete;
  }
  if (2 < *(int *)(in_RSI + 0x110)) {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "BGIP_SolverBranchAndBound Minimum contribution values: ");
    PrintTools::SoftPrintVector<double>(in_stack_00000128);
    poVar5 = std::operator<<(poVar5,local_60);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_60);
  }
  return in_RDI;
}

Assistant:

std::vector<double> ComputeMinContributionValues() const
    {
        std::vector<double> minValues(_m_bgip->GetNrJointTypes());
        for(Index i=0;i!=minValues.size();++i)
        {
            double minValue=DBL_MAX;
            for(Index ja=0;ja!=_m_bgip->GetNrJointActions();++ja)
            {
                double c=GetContribution(i,ja);
                minValue=std::min(c,minValue);
            }
            minValues[i]=minValue;
        }
        
        if(_m_verbosity>2)
            std::cout << "BGIP_SolverBranchAndBound Minimum contribution values: "
                      << SoftPrintVector(minValues)
                      << std::endl;
        return(minValues);
    }